

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_typedef(lyout *out,lys_tpdf *tpdf,int *first)

{
  char *pcVar1;
  bool bVar2;
  int local_24;
  int *piStack_20;
  int f;
  int *first_local;
  lys_tpdf *tpdf_local;
  lyout *out_local;
  
  bVar2 = false;
  if (first != (int *)0x0) {
    bVar2 = *first != 0;
  }
  pcVar1 = ",";
  if (bVar2) {
    pcVar1 = "";
  }
  piStack_20 = first;
  first_local = (int *)tpdf;
  tpdf_local = (lys_tpdf *)out;
  ly_print(out,"%s\"%s\":{",pcVar1,tpdf->name);
  local_24 = 1;
  jsons_print_type((lyout *)tpdf_local,(lys_type *)(first_local + 0xe),&local_24);
  jsons_print_text((lyout *)tpdf_local,"description","text",*(char **)(first_local + 2),1,(int *)0x0
                  );
  jsons_print_text((lyout *)tpdf_local,"reference","text",*(char **)(first_local + 4),1,(int *)0x0);
  jsons_print_status((lyout *)tpdf_local,*(uint16_t *)(first_local + 6),(int *)0x0);
  jsons_print_object((lyout *)tpdf_local,"units","name",*(char **)(first_local + 10),1,(int *)0x0);
  jsons_print_object((lyout *)tpdf_local,"default","value",*(char **)(first_local + 0x1e),1,
                     (int *)0x0);
  ly_print((lyout *)tpdf_local,"}");
  if (piStack_20 != (int *)0x0) {
    *piStack_20 = 0;
  }
  return;
}

Assistant:

static void
jsons_print_typedef(struct lyout *out, const struct lys_tpdf *tpdf, int *first)
{
    int f;

    ly_print(out, "%s\"%s\":{", (first && (*first)) ? "" : ",", tpdf->name);
    f = 1;
    jsons_print_type(out, &tpdf->type, &f);
    jsons_print_text(out, "description", "text", tpdf->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", tpdf->ref, 1, NULL);
    jsons_print_status(out, tpdf->flags, NULL);
    jsons_print_object(out, "units", "name", tpdf->units, 1, NULL);
    jsons_print_object(out, "default", "value", tpdf->dflt, 1, NULL);
    ly_print(out, "}");

    if (first) {
        (*first) = 0;
    }
}